

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  uint8_t *puVar1;
  UBool UVar2;
  byte bVar3;
  char cVar4;
  byte *pbVar5;
  UChar *pUVar6;
  UChar *local_98;
  UChar *noSource;
  byte local_87;
  uint8_t b2;
  uint8_t b1;
  int32_t length;
  UBool hasSupplementary;
  uint uStack_80;
  uint16_t value;
  uint32_t asciiRoundtrips;
  uint32_t stage2Entry;
  uint8_t t2;
  uint8_t t1;
  uint8_t b;
  UChar32 c;
  int8_t toULimit;
  int8_t toULength;
  int8_t oldToULength;
  uint16_t *results;
  uint16_t *mbcsIndex;
  uint16_t *table;
  UChar *pUStack_50;
  int32_t targetCapacity;
  uint8_t *target;
  uint8_t *sourceLimit;
  uint8_t *source;
  UConverter *cnv;
  UConverter *utf8;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pToUArgs_local;
  UConverterFromUnicodeArgs *pFromUArgs_local;
  
  _b2 = 0;
  cnv = pToUArgs->converter;
  source = (uint8_t *)pFromUArgs->converter;
  sourceLimit = (uint8_t *)pToUArgs->source;
  target = (uint8_t *)pToUArgs->sourceLimit;
  pUStack_50 = (UChar *)pFromUArgs->target;
  table._4_4_ = (int)pFromUArgs->targetLimit - (int)pFromUArgs->target;
  mbcsIndex = (((UConverter *)source)->sharedData->mbcs).fromUnicodeTable;
  results = (((UConverter *)source)->sharedData->mbcs).mbcsIndex;
  if ((((UConverter *)source)->options & 0x10) == 0) {
    _c = (((UConverter *)source)->sharedData->mbcs).fromUnicodeBytes;
  }
  else {
    _c = (((UConverter *)source)->sharedData->mbcs).swapLFNLFromUnicodeBytes;
  }
  length = (((UConverter *)source)->sharedData->mbcs).asciiRoundtrips;
  local_87 = (((UConverter *)source)->sharedData->mbcs).unicodeMask & 1;
  if (cnv->toULength < '\x01') {
    t2 = '\0';
    b = '\0';
    stage2Entry = 0;
  }
  else {
    b = cnv->toULength;
    t2 = (uint8_t)cnv->mode;
    stage2Entry = cnv->toUnicodeStatus;
  }
  noSource._4_4_ = ((int)target - (int)sourceLimit) - ((int)(char)t2 - (int)(char)b);
  if ((0 < noSource._4_4_) && (noSource._3_1_ = target[-1], (noSource._3_1_ & 0x80) != 0)) {
    if (((char)noSource._3_1_ < -0x40) && (1 < noSource._4_4_)) {
      noSource._2_1_ = target[-2];
      if (((0xdf < noSource._2_1_) && (noSource._2_1_ < 0xf0)) &&
         (((int)" 000000000000\x1000"[(int)(noSource._2_1_ & 0xf)] &
          1 << (sbyte)((int)(uint)noSource._3_1_ >> 5)) != 0)) {
        target = target + -2;
      }
    }
    else if ((0xc1 < noSource._3_1_) && (noSource._3_1_ < 0xf0)) {
      target = target + -1;
    }
  }
  t1 = b;
  utf8 = (UConverter *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pToUArgs;
  pToUArgs_local = (UConverterToUnicodeArgs *)pFromUArgs;
  if (stage2Entry == 0) goto LAB_00394ed3;
  if (table._4_4_ < 1) goto LAB_00394ed3;
  cnv->toUnicodeStatus = 0;
  cnv->toULength = '\0';
LAB_00395147:
  if ((char)t1 < (char)t2) {
    if (*(uint8_t **)(pErrorCode_local + 6) <= sourceLimit) {
      sourceLimit = sourceLimit + -(long)((int)(char)t1 - (int)(char)b);
      while ((char)b < (char)t1) {
        cnv->toUBytes[(char)b] = *sourceLimit;
        b = b + '\x01';
        sourceLimit = sourceLimit + 1;
      }
      cnv->toUnicodeStatus = stage2Entry;
      cnv->toULength = t1;
      cnv->mode = (int)(char)t2;
      *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
      pToUArgs_local->target = pUStack_50;
      return;
    }
    asciiRoundtrips._3_1_ = *sourceLimit;
    UVar2 = icu_63::UTF8::isValidTrail
                      (stage2Entry,asciiRoundtrips._3_1_,(int)(char)t1,(int)(char)t2);
    if (UVar2 != '\0') {
      sourceLimit = sourceLimit + 1;
      t1 = t1 + '\x01';
      stage2Entry = stage2Entry * 0x40 + (uint)asciiRoundtrips._3_1_;
      goto LAB_00395147;
    }
  }
  if (t1 != t2) {
    sourceLimit = sourceLimit + -(long)((int)(char)t1 - (int)(char)b);
    while ((char)b < (char)t1) {
      cnv->toUBytes[(char)b] = *sourceLimit;
      b = b + '\x01';
      sourceLimit = sourceLimit + 1;
    }
    cnv->toULength = t1;
    *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
    pToUArgs_local->target = pUStack_50;
    *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xc;
    return;
  }
  stage2Entry = stage2Entry - utf8_offsets[(char)t1];
  if ((char)t1 < '\x04') {
    uStack_80 = *(uint *)(mbcsIndex +
                         (long)(int)((uint)mbcsIndex[(int)stage2Entry >> 10] +
                                    ((int)stage2Entry >> 4 & 0x3fU)) * 2);
  }
  else if (local_87 == 0) {
    uStack_80 = 0;
  }
  else {
    uStack_80 = *(uint *)(mbcsIndex +
                         (long)(int)((uint)mbcsIndex[(int)stage2Entry >> 10] +
                                    ((int)stage2Entry >> 4 & 0x3fU)) * 2);
  }
  _b2 = *(ushort *)(_c + (ulong)((uStack_80 & 0xffff) * 0x10 + (stage2Entry & 0xf)) * 2);
  if ((uStack_80 & 1 << (((byte)stage2Entry & 0xf) + 0x10 & 0x1f)) != 0) goto LAB_003953e4;
  if ((((source[0x3f] != '\0') || (stage2Entry - 0xe000 < 0x1900)) ||
      (stage2Entry - 0xf0000 < 0x20000)) && (_b2 != 0)) goto LAB_003953e4;
LAB_00395482:
  do {
    local_98 = L"";
    stage2Entry = _extFromU((UConverter *)source,*(UConverterSharedData **)(source + 0x30),
                            stage2Entry,&local_98,L"",(uint8_t **)&stack0xffffffffffffffb0,
                            (byte *)((long)pUStack_50 + (long)table._4_4_),(int32_t **)0x0,-1,
                            pToUArgs_local->flush,(UErrorCode *)utf8);
    UVar2 = U_FAILURE(*(UErrorCode *)&utf8->fromUCharErrorBehaviour);
    if (UVar2 != '\0') {
      *(uint32_t *)(source + 0x54) = stage2Entry;
LAB_0039554a:
      UVar2 = U_SUCCESS(*(UErrorCode *)&utf8->fromUCharErrorBehaviour);
      if (((UVar2 != '\0') && (*(int *)(source + 0xd0) < 0)) &&
         (puVar1 = *(uint8_t **)(pErrorCode_local + 6), sourceLimit < puVar1)) {
        bVar3 = *sourceLimit;
        cnv->toUBytes[0] = bVar3;
        stage2Entry = (uint32_t)bVar3;
        t1 = '\x01';
        if ((bVar3 & 0x80) == 0) {
          cVar4 = '\x01';
        }
        else if ((byte)(bVar3 + 0x3e) < 0x33) {
          cVar4 = (0xdf < bVar3) + (0xef < bVar3) + '\x02';
        }
        else {
          cVar4 = '\0';
        }
        while (sourceLimit = sourceLimit + 1, sourceLimit < puVar1) {
          bVar3 = *sourceLimit;
          cnv->toUBytes[(char)t1] = bVar3;
          stage2Entry = stage2Entry * 0x40 + (uint)bVar3;
          t1 = t1 + '\x01';
        }
        cnv->toUnicodeStatus = stage2Entry;
        cnv->toULength = t1;
        cnv->mode = (int)cVar4;
      }
      *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
      pToUArgs_local->target = pUStack_50;
      return;
    }
    if (-1 < *(int *)(source + 0xd0)) {
      *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xffffff81;
      goto LAB_0039554a;
    }
    table._4_4_ = (int)pToUArgs_local->targetLimit - (int)pUStack_50;
LAB_00394ed3:
    while( true ) {
      if (target <= sourceLimit) goto LAB_0039554a;
      if (table._4_4_ < 1) {
        *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xf;
        goto LAB_0039554a;
      }
      pbVar5 = sourceLimit + 1;
      asciiRoundtrips._3_1_ = *sourceLimit;
      if ((asciiRoundtrips._3_1_ & 0x80) == 0) break;
      if (asciiRoundtrips._3_1_ < 0xe0) {
        if ((asciiRoundtrips._3_1_ < 0xc2) ||
           (asciiRoundtrips._2_1_ = *pbVar5 + 0x80, 0x3f < asciiRoundtrips._2_1_)) {
          stage2Entry = 0xffffffff;
          sourceLimit = pbVar5;
        }
        else {
          stage2Entry = asciiRoundtrips._3_1_ & 0x1f;
          sourceLimit = sourceLimit + 2;
          _b2 = *(ushort *)
                 (_c + (long)(int)((uint)results[(int)stage2Entry] + (uint)asciiRoundtrips._2_1_) *
                       2);
          if (_b2 == 0) {
            stage2Entry = stage2Entry << 6 | (uint)asciiRoundtrips._2_1_;
            goto LAB_00395482;
          }
        }
      }
      else if (((asciiRoundtrips._3_1_ < 0xee) &&
               (asciiRoundtrips._2_1_ = *pbVar5,
               ((int)" 000000000000\x1000"[(int)(asciiRoundtrips._3_1_ & 0xf)] &
               1 << (sbyte)((int)(uint)asciiRoundtrips._2_1_ >> 5)) != 0)) &&
              (asciiRoundtrips._1_1_ = sourceLimit[2] + 0x80, asciiRoundtrips._1_1_ < 0x40)) {
        stage2Entry = (asciiRoundtrips._3_1_ & 0xf) << 6 | asciiRoundtrips._2_1_ & 0x3f;
        sourceLimit = sourceLimit + 3;
        _b2 = *(ushort *)
               (_c + (long)(int)((uint)results[(int)stage2Entry] + (uint)asciiRoundtrips._1_1_) * 2)
        ;
        if (_b2 == 0) {
          stage2Entry = stage2Entry << 6 | (uint)asciiRoundtrips._1_1_;
          goto LAB_00395482;
        }
      }
      else {
        stage2Entry = 0xffffffff;
        sourceLimit = pbVar5;
      }
      if ((int)stage2Entry < 0) {
        b = '\0';
        t1 = '\x01';
        if ((byte)(asciiRoundtrips._3_1_ + 0x3e) < 0x33) {
          t2 = (0xdf < asciiRoundtrips._3_1_) + (0xef < asciiRoundtrips._3_1_) + '\x02';
        }
        else {
          t2 = '\0';
        }
        stage2Entry = (uint32_t)asciiRoundtrips._3_1_;
        goto LAB_00395147;
      }
LAB_003953e4:
      bVar3 = (byte)_b2;
      if (_b2 < 0x100) {
        *(byte *)pUStack_50 = bVar3;
        table._4_4_ = table._4_4_ + -1;
        pUStack_50 = (UChar *)((long)pUStack_50 + 1);
      }
      else {
        pUVar6 = (UChar *)((long)pUStack_50 + 1);
        *(byte *)pUStack_50 = (byte)(_b2 >> 8);
        if (table._4_4_ < 2) {
          source[0x68] = bVar3;
          source[0x5b] = '\x01';
          *(undefined4 *)&utf8->fromUCharErrorBehaviour = 0xf;
          pUStack_50 = pUVar6;
          goto LAB_0039554a;
        }
        pUStack_50 = pUStack_50 + 1;
        *(byte *)pUVar6 = bVar3;
        table._4_4_ = table._4_4_ + -2;
      }
    }
    if ((length & 1 << ((byte)((int)(uint)asciiRoundtrips._3_1_ >> 2) & 0x1f)) != 0) {
      *(byte *)pUStack_50 = asciiRoundtrips._3_1_;
      table._4_4_ = table._4_4_ + -1;
      pUStack_50 = (UChar *)((long)pUStack_50 + 1);
      sourceLimit = pbVar5;
      goto LAB_00394ed3;
    }
    _b2 = *(ushort *)(_c + (long)(int)((uint)*results + (uint)asciiRoundtrips._3_1_) * 2);
    sourceLimit = pbVar5;
    if (_b2 != 0) goto LAB_003953e4;
    stage2Entry = (uint32_t)asciiRoundtrips._3_1_;
  } while( true );
}

Assistant:

static void U_CALLCONV
ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *mbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t stage2Entry;
    uint32_t asciiRoundtrips;
    uint16_t value = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    mbcsIndex=cnv->sharedData->mbcs.mbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /* See note in ucnv_SBCSFromUTF8() about this goto. */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=b;
                    --targetCapacity;
                    continue;
                } else {
                    value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, 0, b);
                    if(value==0) {
                        c=b;
                        goto unassigned;
                    }
                }
            } else {
                if(b>=0xe0) {
                    if( /* handle U+0800..U+D7FF inline */
                        b<=0xed &&  // do not assume maxFastUChar>0xd7ff
                        U8_IS_VALID_LEAD3_AND_T1(b, t1=source[0]) &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=((b&0xf)<<6)|(t1&0x3f);
                        source+=2;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t2);
                        if(value==0) {
                            c=(c<<6)|t2;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t1);
                        if(value==0) {
                            c=(c<<6)|t1;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                stage2Entry=0;
                            } else {
                                stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }

                    /* get the bytes and the length for the output */
                    /* MBCS_OUTPUT_2 */
                    value=MBCS_VALUE_2_FROM_STAGE_2(results, stage2Entry, c);

                    /* is this code point assigned, or do we use fallbacks? */
                    if(!(MBCS_FROM_U_IS_ROUNDTRIP(stage2Entry, c) ||
                         (UCNV_FROM_U_USE_FALLBACK(cnv, c) && value!=0))
                    ) {
                        goto unassigned;
                    }
                }
            }

            /* write the output character bytes from value and length */
            /* from the first if in the loop we know that targetCapacity>0 */
            if(value<=0xff) {
                /* this is easy because we know that there is enough space */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else /* length==2 */ {
                *target++=(uint8_t)(value>>8);
                if(2<=targetCapacity) {
                    *target++=(uint8_t)value;
                    targetCapacity-=2;
                } else {
                    cnv->charErrorBuffer[0]=(char)value;
                    cnv->charErrorBufferLength=1;

                    /* target overflow */
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
            continue;

unassigned:
            {
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                    continue;
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}